

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O0

int Gia_ManBmcPerformInt(Gia_Man_t *pGia,Bmc_AndPar_t *pPars)

{
  sat_solver *s;
  Vec_Int_t *pVVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  abctime aVar11;
  abctime aVar12;
  Gia_Man_t *pGVar13;
  Cnf_Dat_t *pCVar14;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar15;
  Gia_Obj_t *pGVar16;
  Abc_Cex_t *pAVar17;
  char *pcVar18;
  double dVar19;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 uVar20;
  abctime local_60;
  Gia_Obj_t *pObj;
  abctime clk;
  int RetValue;
  int status;
  int Lit;
  int i;
  int f;
  int nFramesMax;
  Gia_Man_t *pTemp;
  Bmc_Mna_t *p;
  Bmc_AndPar_t *pPars_local;
  Gia_Man_t *pGia_local;
  
  status = 0;
  RetValue = 1;
  clk._0_4_ = -2;
  p = (Bmc_Mna_t *)pPars;
  pPars_local = (Bmc_AndPar_t *)pGia;
  aVar11 = Abc_Clock();
  pTemp = (Gia_Man_t *)Bmc_MnaAlloc();
  s = *(sat_solver **)&pTemp->nBufs;
  if (*(int *)&p->vPiMap == 0) {
    local_60 = 0;
  }
  else {
    iVar3 = *(int *)&p->vPiMap;
    aVar12 = Abc_Clock();
    local_60 = (long)iVar3 * 1000000 + aVar12;
  }
  sat_solver_set_runtime_limit(s,local_60);
  pGVar13 = Gia_ManBmcUnroll((Gia_Man_t *)pPars_local,*(int *)((long)&p->pFrames + 4),
                             *(int *)&p->pCnf,*(int *)&p->pSat,(Vec_Int_t **)&pTemp->nRegs);
  pTemp->pName = (char *)pGVar13;
  iVar3 = Gia_ManPoNum((Gia_Man_t *)pTemp->pName);
  iVar4 = Gia_ManPoNum((Gia_Man_t *)pPars_local);
  uVar5 = iVar3 / iVar4;
  i = uVar5;
  if (*(int *)((long)&p->vNodes + 4) != 0) {
    uVar6 = Gia_ManBmcFindFirst((Gia_Man_t *)pTemp->pName);
    printf("Unfolding for %d frames with first non-trivial PO %d.  ",(ulong)uVar5,(ulong)uVar6);
    aVar12 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar12 - aVar11);
  }
  if (*(int *)((long)&p->vInputs + 4) == 0) {
    if (*(int *)((long)&p->vNodes + 4) != 0) {
      Gia_ManPrintStats((Gia_Man_t *)pTemp->pName,(Gps_Par_t *)0x0);
    }
  }
  else {
    _f = (Gia_Man_t *)pTemp->pName;
    iVar3 = *(int *)((long)&p->vNodes + 4);
    in_stack_fffffffffffffee8 = CONCAT44((int)((ulong)in_stack_fffffffffffffee8 >> 0x20),iVar3);
    pGVar13 = Gia_ManAigSyn2(_f,1,0,0,0,0,iVar3,0);
    pTemp->pName = (char *)pGVar13;
    Gia_ManStop(_f);
  }
  if (*(int *)&p->vInputs != 0) {
    Gia_AigerWrite((Gia_Man_t *)pTemp->pName,"frames.aig",0,0,0);
    printf("Dumped unfolded frames into file \"frames.aig\".\n");
  }
  if (*(int *)&p->vOutputs == 0) {
    pcVar18 = (char *)Mf_ManGenerateCnf((Gia_Man_t *)pTemp->pName,*(int *)((long)&p->vPiMap + 4),1,0
                                        ,0,*(int *)((long)&p->vNodes + 4));
    pTemp->pSpec = pcVar18;
  }
  else {
    pCVar14 = Cnf_DeriveGia((Gia_Man_t *)pTemp->pName);
    pTemp->pSpec = (char *)pCVar14;
  }
  pVVar1 = *(Vec_Int_t **)&pTemp->nObjs;
  iVar3 = Gia_ManObjNum((Gia_Man_t *)pTemp->pName);
  Vec_IntFillExtra(pVVar1,iVar3,0);
  Lit = 0;
  do {
    iVar3 = Lit;
    if (i <= Lit) {
LAB_006c3f58:
      if ((int)clk == -2) {
        clk._0_4_ = -1;
      }
      Gia_ManStop((Gia_Man_t *)pTemp->pName);
      Bmc_MnaFree((Bmc_Mna_t *)pTemp);
      return (int)clk;
    }
    pGVar13 = (Gia_Man_t *)pTemp->pName;
    iVar4 = Gia_ManPoNum((Gia_Man_t *)pPars_local);
    iVar7 = Lit + 1;
    iVar8 = Gia_ManPoNum((Gia_Man_t *)pPars_local);
    iVar4 = Gia_ManBmcCheckOutputs(pGVar13,iVar3 * iVar4,iVar7 * iVar8);
    pGVar13 = pTemp;
    iVar3 = Lit;
    if (iVar4 == 0) {
      iVar4 = Gia_ManPoNum((Gia_Man_t *)pPars_local);
      iVar7 = Lit + 1;
      iVar8 = Gia_ManPoNum((Gia_Man_t *)pPars_local);
      Gia_ManBmcAddCnfNew((Bmc_Mna_t *)pGVar13,iVar3 * iVar4,iVar7 * iVar8);
      iVar3 = Lit;
      iVar4 = Gia_ManPoNum((Gia_Man_t *)pPars_local);
      for (status = iVar3 * iVar4; iVar3 = status, iVar4 = Lit + 1,
          iVar7 = Gia_ManPoNum((Gia_Man_t *)pPars_local), iVar3 < iVar4 * iVar7; status = status + 1
          ) {
        pObj_00 = Gia_ManPo((Gia_Man_t *)pTemp->pName,status);
        pGVar15 = Gia_ObjChild0(pObj_00);
        pGVar16 = Gia_ManConst0((Gia_Man_t *)pTemp->pName);
        if (pGVar15 != pGVar16) {
          pGVar15 = Gia_ObjChild0(pObj_00);
          pGVar16 = Gia_ManConst1((Gia_Man_t *)pTemp->pName);
          if (pGVar15 == pGVar16) {
            printf("Output %d is trivially SAT.\n",(ulong)(uint)status);
          }
          else {
            pVVar1 = *(Vec_Int_t **)&pTemp->nObjs;
            iVar3 = Gia_ObjId((Gia_Man_t *)pTemp->pName,pObj_00);
            iVar3 = Vec_IntEntry(pVVar1,iVar3);
            RetValue = Abc_Var2Lit(iVar3,0);
            in_stack_fffffffffffffee8 = 0;
            iVar3 = sat_solver_solve(*(sat_solver **)&pTemp->nBufs,&RetValue,&status,
                                     (long)*(int *)((long)&p->pCnf + 4),0,0,0);
            if (iVar3 != -1) {
              if (iVar3 == 1) {
                clk._0_4_ = 0;
              }
              if (iVar3 == 0) {
                clk._0_4_ = -1;
              }
              break;
            }
          }
        }
      }
      iVar3 = Lit;
      uVar20 = (undefined4)((ulong)in_stack_fffffffffffffee8 >> 0x20);
      if (*(int *)((long)&p->vNodes + 4) != 0) {
        uVar5 = Gia_ManPiNum((Gia_Man_t *)pTemp->pName);
        uVar6 = Gia_ManAndNum((Gia_Man_t *)pTemp->pName);
        iVar4 = *(int *)&pTemp->vCis;
        uVar9 = Vec_IntSize((Vec_Int_t *)pTemp->pObjs);
        iVar7 = Vec_IntSize(*(Vec_Int_t **)&pTemp->nXors);
        iVar8 = sat_solver_nclauses(*(sat_solver **)&pTemp->nBufs);
        iVar10 = sat_solver_nconflicts(*(sat_solver **)&pTemp->nBufs);
        dVar19 = Gia_ManMemory((Gia_Man_t *)pTemp->pName);
        in_stack_fffffffffffffee8 = CONCAT44(uVar20,iVar7);
        printf("%4d :  PI =%9d.  AIG =%9d.  Var =%8d.  In =%6d.  And =%9d.  Cla =%9d.  Conf =%9d.  Mem =%7.1f MB   "
               ,dVar19 / 1048576.0,(ulong)(uint)iVar3,(ulong)uVar5,(ulong)uVar6,(ulong)(iVar4 - 1),
               (ulong)uVar9,in_stack_fffffffffffffee8,iVar8,iVar10);
        aVar11 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar11 - (long)pTemp->vCos);
      }
    }
    if ((int)clk != -2) {
      if ((int)clk == -1) {
        printf("SAT solver reached conflict/runtime limit in frame %d.\n",(ulong)(uint)Lit);
      }
      else {
        lVar2._0_4_ = pPars_local[4].nProcs;
        lVar2._4_4_ = pPars_local[4].fLoadCnf;
        if (lVar2 != 0) {
          free(*(void **)&pPars_local[4].nProcs);
          pPars_local[4].nProcs = 0;
          pPars_local[4].fLoadCnf = 0;
        }
        pAVar17 = Gia_ManBmcCexGen((Bmc_Mna_t *)pTemp,(Gia_Man_t *)pPars_local,status);
        iVar4 = Lit;
        iVar3 = status;
        *(Abc_Cex_t **)&pPars_local[4].nProcs = pAVar17;
        iVar7 = Gia_ManPoNum((Gia_Man_t *)pPars_local);
        pcVar18 = Gia_ManName((Gia_Man_t *)pPars_local);
        printf("Output %d of miter \"%s\" was asserted in frame %d.  ",
               (ulong)(uint)(iVar3 - iVar4 * iVar7),pcVar18,(ulong)(uint)Lit);
        aVar11 = Abc_Clock();
        Abc_PrintTime(1,"Time",aVar11 - (long)pTemp->vCos);
      }
      goto LAB_006c3f58;
    }
    p->nSatVars = Lit;
    Lit = Lit + 1;
  } while( true );
}

Assistant:

int Gia_ManBmcPerformInt( Gia_Man_t * pGia, Bmc_AndPar_t * pPars )
{
    Bmc_Mna_t * p;
    Gia_Man_t * pTemp;
    int nFramesMax, f, i=0, Lit = 1, status, RetValue = -2;
    abctime clk = Abc_Clock();
    p = Bmc_MnaAlloc();
    sat_solver_set_runtime_limit( p->pSat, pPars->nTimeOut ? pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    p->pFrames = Gia_ManBmcUnroll( pGia, pPars->nFramesMax, pPars->nFramesAdd, pPars->fVeryVerbose, &p->vPiMap );
    nFramesMax = Gia_ManPoNum(p->pFrames) / Gia_ManPoNum(pGia);
    if ( pPars->fVerbose )
    {
        printf( "Unfolding for %d frames with first non-trivial PO %d.  ", nFramesMax, Gia_ManBmcFindFirst(p->pFrames) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    if ( pPars->fUseSynth )
    {
        p->pFrames = Gia_ManAigSyn2( pTemp = p->pFrames, 1, 0, 0, 0, 0, pPars->fVerbose, 0 );  Gia_ManStop( pTemp );
    }
    else if ( pPars->fVerbose )
        Gia_ManPrintStats( p->pFrames, NULL );
    if ( pPars->fDumpFrames )
    {
        Gia_AigerWrite( p->pFrames, "frames.aig", 0, 0, 0 );
        printf( "Dumped unfolded frames into file \"frames.aig\".\n" );
    }
    if ( pPars->fUseOldCnf )
        p->pCnf = Cnf_DeriveGia( p->pFrames );
    else
    {
//        p->pFrames = Jf_ManDeriveCnf( pTemp = p->pFrames, 1 );  Gia_ManStop( pTemp );
//        p->pCnf = (Cnf_Dat_t *)p->pFrames->pData; p->pFrames->pData = NULL;
        p->pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p->pFrames, pPars->nLutSize, 1, 0, 0, pPars->fVerbose );
    }
    Vec_IntFillExtra( p->vId2Var, Gia_ManObjNum(p->pFrames), 0 );
    // create clauses for constant node
//    sat_solver_addclause( p->pSat, &Lit, &Lit + 1 );
    for ( f = 0; f < nFramesMax; f++ )
    {
        if ( !Gia_ManBmcCheckOutputs( p->pFrames, f * Gia_ManPoNum(pGia), (f+1) * Gia_ManPoNum(pGia) ) )
        {
            // create another slice
            Gia_ManBmcAddCnfNew( p, f * Gia_ManPoNum(pGia), (f+1) * Gia_ManPoNum(pGia) );
            // try solving the outputs
            for ( i = f * Gia_ManPoNum(pGia); i < (f+1) * Gia_ManPoNum(pGia); i++ )
            {
                Gia_Obj_t * pObj = Gia_ManPo(p->pFrames, i);
                if ( Gia_ObjChild0(pObj) == Gia_ManConst0(p->pFrames) )
                    continue;
                if ( Gia_ObjChild0(pObj) == Gia_ManConst1(p->pFrames) )
                {
                    printf( "Output %d is trivially SAT.\n", i );
                    continue;
                }
                Lit = Abc_Var2Lit( Vec_IntEntry(p->vId2Var, Gia_ObjId(p->pFrames, pObj)), 0 );
                status = sat_solver_solve( p->pSat, &Lit, &Lit + 1, (ABC_INT64_T)pPars->nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
                if ( status == l_False ) // unsat
                    continue;
                if ( status == l_True )  // sat
                    RetValue = 0;
                if ( status == l_Undef ) // undecided
                    RetValue = -1;
                break;
            }
            // report statistics
            if ( pPars->fVerbose )
            {
                printf( "%4d :  PI =%9d.  AIG =%9d.  Var =%8d.  In =%6d.  And =%9d.  Cla =%9d.  Conf =%9d.  Mem =%7.1f MB   ", 
                    f, Gia_ManPiNum(p->pFrames), Gia_ManAndNum(p->pFrames), 
                    p->nSatVars-1, Vec_IntSize(p->vInputs), Vec_IntSize(p->vNodes), 
                    sat_solver_nclauses(p->pSat), sat_solver_nconflicts(p->pSat), Gia_ManMemory(p->pFrames)/(1<<20) );
                Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
            }
        }
        if ( RetValue != -2 )
        {
            if ( RetValue == -1 )
                printf( "SAT solver reached conflict/runtime limit in frame %d.\n", f );
            else
            {
                ABC_FREE( pGia->pCexSeq );
                pGia->pCexSeq = Gia_ManBmcCexGen( p, pGia, i );
                printf( "Output %d of miter \"%s\" was asserted in frame %d.  ", 
                    i - f * Gia_ManPoNum(pGia), Gia_ManName(pGia), f );
                Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
            }
            break;
        }
        pPars->iFrame = f;
    }
    if ( RetValue == -2 )
        RetValue = -1;
    // cleanup
    Gia_ManStop( p->pFrames );
    Bmc_MnaFree( p );
    return RetValue;
}